

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCatchExpr(BinaryReaderIR *this,Index except_index)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  Expr *pEVar2;
  _func_int ***ppp_Var3;
  Result RVar4;
  Location loc;
  Location local_120;
  Var local_100;
  Catch local_b8;
  
  __s = this->filename_;
  aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_120.field_1.field_0.last_column = 0;
  local_120.filename._M_len = strlen(__s);
  local_120.filename._M_str = __s;
  local_120.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
  Var::Var(&local_100,except_index,&local_120);
  local_b8.loc.field_1.field_0.line = 0;
  local_b8.loc.field_1._4_8_ = 0;
  local_b8.loc.filename._M_len = 0;
  local_b8.loc.filename._M_str._0_4_ = 0;
  local_b8.loc.filename._M_str._4_4_ = 0;
  Var::Var(&local_b8.var,&local_100);
  local_b8.exprs.first_ = (Expr *)0x0;
  local_b8.exprs.last_ = (Expr *)0x0;
  local_b8.exprs.size_ = 0;
  RVar4 = AppendCatch(this,&local_b8);
  pEVar2 = local_b8.exprs.first_;
  while (pEVar2 != (Expr *)0x0) {
    ppp_Var3 = &pEVar2->_vptr_Expr;
    pEVar2 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var3)[1])();
  }
  local_b8.exprs.first_ = (Expr *)0x0;
  local_b8.exprs.last_ = (Expr *)0x0;
  local_b8.exprs.size_ = 0;
  Var::~Var(&local_b8.var);
  Var::~Var(&local_100);
  return (Result)RVar4.enum_;
}

Assistant:

Result BinaryReaderIR::OnCatchExpr(Index except_index) {
  return AppendCatch(Catch(Var(except_index, GetLocation())));
}